

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pine.hh
# Opt level: O1

void __thiscall OB::Regex::~Regex(Regex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->str_)._M_dataplus._M_p;
  paVar1 = &(this->str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            (&this->super_regex);
  return;
}

Assistant:

Regex(const char* cstr) : std::regex {cstr}, str_ {cstr} {}